

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpf_reader.cpp
# Opt level: O2

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
RPF_reader::load_rpf_2
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,RPF_reader *this,
          string *file_to_read)

{
  int *__lhs;
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  stringstream local_510 [8];
  stringstream ss;
  ostream local_500 [376];
  long local_388;
  ifstream inFile;
  byte abStack_368 [488];
  undefined1 local_180 [8];
  Mirror incomming_mirror;
  Point_d sample_position;
  string line;
  vector<Point_d,_std::allocator<Point_d>_> sampled_positions;
  Point_d m_position;
  Point_d displayed_sample;
  string keyword;
  int id;
  
  std::ifstream::ifstream(&local_388);
  sample_position._24_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Point_d::Point_d((Point_d *)
                   &sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,999999.0,99999.0,99999.0,9999999);
  Point_d::Point_d((Point_d *)&m_position.id,999999.0,99999.0,99999.0,9999999);
  line.field_2._8_8_ = 0;
  sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Point_d::Point_d((Point_d *)
                   &incomming_mirror._disp_pixels.
                    super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,999999.0,99999.0,99999.0,9999999);
  std::ifstream::open((string *)&local_388,(_Ios_Openmode)file_to_read);
  if ((abStack_368[*(long *)(local_388 + -0x18)] & 5) == 0) {
    __lhs = &displayed_sample.id;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_388,(string *)&sample_position.id);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_510);
      displayed_sample._24_8_ = &keyword._M_string_length;
      keyword._M_dataplus._M_p = (pointer)0x0;
      keyword._M_string_length._0_1_ = 0;
      std::operator<<(local_500,(string *)&sample_position.id);
      std::operator>>((istream *)local_510,(string *)__lhs);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"id");
      if (bVar1) {
        std::istream::operator>>((istream *)local_510,(int *)(keyword.field_2._M_local_buf + 0xc));
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"pos");
      if (bVar1) {
        std::istream::_M_extract<double>((double *)local_510);
        std::istream::_M_extract<double>((double *)local_510);
        std::istream::_M_extract<double>((double *)local_510);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"dis_sample");
      if (bVar1) {
        std::istream::_M_extract<double>((double *)local_510);
        std::istream::_M_extract<double>((double *)local_510);
        std::istream::_M_extract<double>((double *)local_510);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"---");
      if (bVar1) {
        Mirror::Mirror((Mirror *)local_180);
        local_180._0_4_ = keyword.field_2._12_4_;
        incomming_mirror._position._12_8_ = m_position._12_8_;
        incomming_mirror._0_8_ =
             sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        incomming_mirror._displayed_sample._12_8_ = displayed_sample._12_8_;
        incomming_mirror._ammount_of_matching_samples = m_position.id;
        incomming_mirror._68_4_ = m_position._28_4_;
        std::vector<Mirror,_std::allocator<Mirror>_>::push_back
                  (__return_storage_ptr__,(Mirror *)local_180);
        Mirror::~Mirror((Mirror *)local_180);
      }
      std::__cxx11::string::~string((string *)__lhs);
      std::__cxx11::stringstream::~stringstream(local_510);
    }
    std::_Vector_base<Point_d,_std::allocator<Point_d>_>::~_Vector_base
              ((_Vector_base<Point_d,_std::allocator<Point_d>_> *)((long)&line.field_2 + 8));
    std::__cxx11::string::~string((string *)&sample_position.id);
    std::ifstream::~ifstream(&local_388);
    return __return_storage_ptr__;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to open file ");
  std::operator<<(poVar3,(string *)file_to_read);
  exit(1);
}

Assistant:

std::vector<Mirror> RPF_reader::load_rpf_2(std::string const& file_to_read){
    std::ifstream inFile;
    std::string line;
    std::vector<Mirror> loadedMirrors;
    Point_d m_position;
    Point_d displayed_sample;
    std::vector<Point_d> sampled_positions;
    Point_d sample_position;


    inFile.open(file_to_read);
    if (!inFile) {
        std::cerr << "Unable to open file "<<file_to_read;
        exit(1);   // call system to stop
    }
    else{
      while(std::getline(inFile, line)){

        std::stringstream ss;
        std::string keyword;


        //------------------------------------------------------
        //------------------------------------------------------
  /*
        int id;
        Point_d _position;
        std::vector<Point_d> _matching_samples;
        // value ammount of _matching_samples  not used???
        int _ammount_of_matching_samples = 0;
        Point_d _displayed_sample;
        bool has_sample = false;
        */
        //------------------------------------------------------
        //------------------------------------------------------

        ss << line;
        ss >> keyword;


        int id;

        if(keyword == "id"){
      //  std::cout <<"keyword: m_id " << '\n';
          ss >> id;

        }


        if(keyword == "pos"){
  //      std::cout <<"keyword: m_pos " << '\n';

          ss >> m_position.x;
          ss >> m_position.y;
          ss >> m_position.dis;

        }
//        std::cout <<"keyword: m_pos.y "<< m_position.y << '\n';


        bool displayed = true;

        if(keyword == "dis_sample"){
//          std::cout <<"keyword: displayed_sample " << '\n';

//          ss >> displayed_sample.id;
          ss >> displayed_sample.x;
          ss >> displayed_sample.y;
          ss >> displayed_sample.dis;
          if(displayed_sample.dis == 99999){
            displayed = false;
          }
        }
/*
        int sample_amount;

        if(keyword == "sample_amount"){
  //        std::cout <<"keyword: sample_ammount " << '\n';

          ss >> sample_amount;
        }

        if(keyword == "pos"){
    //      std::cout <<"keyword: pos " << '\n';


          ss >> sample_position.id;
          ss >> sample_position.x;
          ss >> sample_position.y;
          ss >> sample_position.dis;

          sampled_positions.push_back(sample_position);

        }
*/
        if(keyword == "---"){
    //      std::cout <<"keyword: --- " << '\n';

          Mirror incomming_mirror;

          incomming_mirror.id = id;
          incomming_mirror._position = m_position;
          incomming_mirror._displayed_sample = displayed_sample;
//          incomming_mirror._ammount_of_matching_samples = sample_amount;
//          incomming_mirror._matching_samples = sampled_positions;
//          incomming_mirror.has_sample = displayed;

          loadedMirrors.push_back(incomming_mirror);

        }
      }
    }
    return loadedMirrors;
  }